

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalogManager.cpp
# Opt level: O1

void __thiscall catalog::showTable(catalog *this)

{
  TableInfo *pTVar1;
  ostream *poVar2;
  long lVar3;
  
  if (0 < this->tableNumber) {
    lVar3 = 0;
    do {
      pTVar1 = (this->TableInfoList).super__Vector_base<TableInfo_*,_std::allocator<TableInfo_*>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar3];
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(pTVar1->tableName)._M_dataplus._M_p,
                          (pTVar1->tableName)._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      lVar3 = lVar3 + 1;
    } while (lVar3 < this->tableNumber);
  }
  return;
}

Assistant:

void catalog::showTable(){
    for(int i = 0 ; i < tableNumber ; i ++){
        std::cout<<TableInfoList[i]->tableName<<std::endl;
    }
}